

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# respond.c
# Opt level: O1

void resp0_ctx_send(void *arg,nni_aio *aio)

{
  uint uVar1;
  nni_mtx *mtx;
  _Bool _Var2;
  nng_err result;
  nni_msg *m;
  undefined8 *puVar3;
  size_t sVar4;
  
  mtx = *arg;
  m = nni_aio_get_msg(aio);
  nni_msg_header_clear(m);
  if ((void *)((long)&mtx[2].mtx + 0x18) == arg) {
    nni_pollable_clear((nni_pollable *)&mtx[7].mtx.__data.__list.__next);
  }
  nni_mtx_lock(mtx);
  _Var2 = nni_aio_start(aio,resp0_ctx_cancel_send,arg);
  if (_Var2) {
    sVar4 = *(size_t *)((long)arg + 0x48);
    if (sVar4 == 0) {
      nni_mtx_unlock(mtx);
      result = NNG_ESTATE;
    }
    else {
      uVar1 = *(uint *)((long)arg + 8);
      *(undefined4 *)((long)arg + 8) = 0;
      *(undefined8 *)((long)arg + 0x48) = 0;
      result = nni_msg_header_append(m,(void *)((long)arg + 0x50),sVar4);
      if (result == NNG_OK) {
        puVar3 = (undefined8 *)nni_id_get((nni_id_map *)((long)&mtx[1].mtx + 8),(ulong)uVar1);
        if (puVar3 == (undefined8 *)0x0) {
          nni_mtx_unlock(mtx);
          nni_aio_set_msg(aio,(nni_msg *)0x0);
          sVar4 = nni_msg_len(m);
          nni_aio_finish(aio,NNG_OK,sVar4);
          nni_msg_free(m);
          return;
        }
        if (*(char *)(puVar3 + 2) == '\0') {
          *(undefined1 *)(puVar3 + 2) = 1;
          sVar4 = nni_msg_len(m);
          nni_aio_set_msg((nni_aio *)(puVar3 + 6),m);
          nni_pipe_send((nni_pipe *)*puVar3,(nni_aio *)(puVar3 + 6));
          nni_mtx_unlock(mtx);
          nni_aio_set_msg(aio,(nni_msg *)0x0);
          nni_aio_finish(aio,NNG_OK,sVar4);
          return;
        }
        *(nni_aio **)((long)arg + 0x18) = aio;
        *(undefined8 **)((long)arg + 0x10) = puVar3;
        nni_list_append((nni_list *)(puVar3 + 3),arg);
        goto LAB_0011f470;
      }
      nni_mtx_unlock(mtx);
    }
    nni_aio_finish_error(aio,result);
    return;
  }
LAB_0011f470:
  nni_mtx_unlock(mtx);
  return;
}

Assistant:

static void
resp0_ctx_send(void *arg, nni_aio *aio)
{
	resp0_ctx  *ctx = arg;
	resp0_sock *s   = ctx->sock;
	resp0_pipe *p;
	nni_msg    *msg;
	size_t      len;
	uint32_t    pid;
	int         rv;

	msg = nni_aio_get_msg(aio);
	nni_msg_header_clear(msg);

	if (ctx == &s->ctx) {
		// We can't send anymore, because only one send per request.
		nni_pollable_clear(&s->writable);
	}

	nni_mtx_lock(&s->mtx);
	if (!nni_aio_start(aio, resp0_ctx_cancel_send, ctx)) {
		nni_mtx_unlock(&s->mtx);
		return;
	}

	if ((len = ctx->btrace_len) == 0) {
		nni_mtx_unlock(&s->mtx);
		nni_aio_finish_error(aio, NNG_ESTATE);
		return;
	}
	pid             = ctx->pipe_id;
	ctx->pipe_id    = 0;
	ctx->btrace_len = 0;

	if ((rv = nni_msg_header_append(msg, ctx->btrace, len)) != 0) {
		nni_mtx_unlock(&s->mtx);
		nni_aio_finish_error(aio, rv);
		return;
	}

	if ((p = nni_id_get(&s->pipes, pid)) == NULL) {
		// Surveyor has left the building.  Just discard the reply.
		nni_mtx_unlock(&s->mtx);
		nni_aio_set_msg(aio, NULL);
		nni_aio_finish(aio, 0, nni_msg_len(msg));
		nni_msg_free(msg);
		return;
	}

	if (!p->busy) {
		p->busy = true;
		len     = nni_msg_len(msg);
		nni_aio_set_msg(&p->aio_send, msg);
		nni_pipe_send(p->npipe, &p->aio_send);
		nni_mtx_unlock(&s->mtx);

		nni_aio_set_msg(aio, NULL);
		nni_aio_finish(aio, 0, len);
		return;
	}

	ctx->saio  = aio;
	ctx->spipe = p;
	nni_list_append(&p->sendq, ctx);
	nni_mtx_unlock(&s->mtx);
}